

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O0

void beltCHEStepA(void *buf,size_t count,void *state)

{
  void *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *unaff_retaddr;
  belt_che_st *st;
  undefined7 in_stack_ffffffffffffffd8;
  octet in_stack_ffffffffffffffdf;
  void *stack;
  
  stack = in_RDX;
  if (((in_RSI != (word *)0x0) && (*(long *)((long)in_RDX + 0x68) == 0)) &&
     (*(long *)((long)in_RDX + 0x90) != 0)) {
    memSet(in_RDX,in_stack_ffffffffffffffdf,0x147c29);
    *(ulong *)((long)in_RDX + 0x40) =
         *(ulong *)((long)in_RDX + 0x70) ^ *(ulong *)((long)in_RDX + 0x40);
    *(ulong *)((long)in_RDX + 0x48) =
         *(ulong *)((long)in_RDX + 0x78) ^ *(ulong *)((long)in_RDX + 0x48);
    beltPolyMul(unaff_retaddr,in_RDI,in_RSI,stack);
    *(undefined8 *)((long)in_RDX + 0x90) = 0;
  }
  beltHalfBlockAddBitSizeW((word *)((long)in_RDX + 0x68),(size_t)in_RSI);
  if (*(long *)((long)in_RDX + 0x90) != 0) {
    if (in_RSI < (word *)(0x10U - *(long *)((long)in_RDX + 0x90))) {
      memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x147cfa)
      ;
      *(long *)((long)in_RDX + 0x90) = (long)in_RSI + *(long *)((long)in_RDX + 0x90);
      return;
    }
    memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x147d47);
    in_RSI = (word *)((long)in_RSI - (0x10 - *(long *)((long)in_RDX + 0x90)));
    in_RDI = (word *)((long)in_RDI + (0x10 - *(long *)((long)in_RDX + 0x90)));
    *(ulong *)((long)in_RDX + 0x40) =
         *(ulong *)((long)in_RDX + 0x70) ^ *(ulong *)((long)in_RDX + 0x40);
    *(ulong *)((long)in_RDX + 0x48) =
         *(ulong *)((long)in_RDX + 0x78) ^ *(ulong *)((long)in_RDX + 0x48);
    beltPolyMul(unaff_retaddr,in_RDI,in_RSI,stack);
    *(undefined8 *)((long)in_RDX + 0x90) = 0;
  }
  for (; (word *)0xf < in_RSI; in_RSI = in_RSI + -2) {
    *(word *)((long)in_RDX + 0x70) = *in_RDI;
    *(word *)((long)in_RDX + 0x78) = in_RDI[1];
    *(ulong *)((long)in_RDX + 0x40) =
         *(ulong *)((long)in_RDX + 0x70) ^ *(ulong *)((long)in_RDX + 0x40);
    *(ulong *)((long)in_RDX + 0x48) =
         *(ulong *)((long)in_RDX + 0x78) ^ *(ulong *)((long)in_RDX + 0x48);
    beltPolyMul(unaff_retaddr,in_RDI,in_RSI,stack);
    in_RDI = in_RDI + 2;
  }
  if (in_RSI != (word *)0x0) {
    *(word **)((long)in_RDX + 0x90) = in_RSI;
    memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x147ec2);
  }
  return;
}

Assistant:

void beltCHEStepA(const void* buf, size_t count, void* state)
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCHE_keep()));
	// первый непустой фрагмент критических данных?
	// есть необработанные открытые данные?
	if (count && beltHalfBlockIsZero(st->len + W_OF_B(64)) && st->filled)
	{
		memSetZero(st->block + st->filled, 16 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		st->filled = 0;
	}
	// обновить длину
	beltHalfBlockAddBitSizeW(st->len + W_OF_B(64), count);
	// есть накопленные данные?
	if (st->filled)
	{
		if (count < 16 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 16 - st->filled);
		count -= 16 - st->filled;
		buf = (const octet*)buf + 16 - st->filled;
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		st->filled = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockCopy(st->block, buf);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		buf = (const octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
		memCopy(st->block, buf, st->filled = count);
}